

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

bool __thiscall bloaty::ArgParser::TryParseOption(ArgParser *this,string_view flag,string_view *val)

{
  char cVar1;
  ulong __n;
  bool bVar2;
  int iVar3;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  char *pcVar8;
  Arg *in_R8;
  string_view sVar9;
  string_view format;
  string local_80;
  long *local_60;
  char *local_58;
  long local_50;
  long lStack_48;
  ulong uVar4;
  
  pcVar8 = flag._M_str;
  plVar5 = (long *)flag._M_len;
  if (plVar5 < (long *)0x2) {
    __assert_fail("flag.size() > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x80e,"bool bloaty::ArgParser::TryParseOption(string_view, string_view *)");
  }
  cVar1 = pcVar8[1];
  sVar9 = Arg(this);
  uVar4 = sVar9._M_len;
  bVar2 = TryParseFlag(this,flag);
  if (bVar2) {
    if (this->index_ == this->argc_) {
      format._M_str = (char *)&local_60;
      format._M_len = (size_t)"option \'$0\' requires an argument";
      local_60 = plVar5;
      local_58 = pcVar8;
      absl::Substitute_abi_cxx11_(&local_80,(absl *)0x20,format,in_R8);
      Throw(local_80._M_dataplus._M_p,0x813);
    }
    sVar9 = Arg(this);
    this->index_ = this->index_ + 1;
    *val = sVar9;
  }
  else {
    if (cVar1 == '-') {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,pcVar8,pcVar8 + (long)plVar5);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_60 = &local_50;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_50 = *plVar7;
        lStack_48 = plVar5[3];
      }
      else {
        local_50 = *plVar7;
        local_60 = (long *)*plVar5;
      }
      __n = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_58 = (char *)__n;
      if (__n == 0) {
        bVar2 = true;
      }
      else if (uVar4 < __n) {
        bVar2 = false;
      }
      else {
        iVar3 = bcmp(sVar9._M_str,local_60,__n);
        bVar2 = iVar3 == 0;
      }
      uVar6 = 0;
      if (bVar2) {
        uVar6 = __n;
      }
      sVar9._M_str = sVar9._M_str + uVar6;
      sVar9._M_len = uVar4 - uVar6;
    }
    else {
      bVar2 = false;
    }
    if (cVar1 == '-') {
      if (local_60 != &local_50) {
        operator_delete(local_60,local_50 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    if (!bVar2) {
      return false;
    }
    *val = sVar9;
    this->index_ = this->index_ + 1;
  }
  return true;
}

Assistant:

bool TryParseOption(string_view flag, string_view* val) {
    assert(flag.size() > 1);
    bool is_long = flag[1] == '-';
    string_view arg = Arg();
    if (TryParseFlag(flag)) {
      if (IsDone()) {
        THROWF("option '$0' requires an argument", flag);
      }
      *val = ConsumeArg();
      return true;
    } else if (is_long && absl::ConsumePrefix(&arg, std::string(flag) + "=")) {
      *val = arg;
      index_++;
      return true;
    } else {
      return false;
    }
  }